

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

int compute_codewords(Codebook *c,uint8 *len,int n,uint32 *values)

{
  uint8 uVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint32 uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint32 available [32];
  uint local_b8 [34];
  
  uVar12 = 0;
  SDL_memset(local_b8,0,0x80);
  if (0 < n) {
    uVar12 = 0;
    do {
      if (len[uVar12] != 0xff) goto LAB_00124599;
      uVar12 = uVar12 + 1;
    } while ((uint)n != uVar12);
    uVar12 = (ulong)(uint)n;
  }
LAB_00124599:
  uVar11 = (uint32)uVar12;
  if (uVar11 != n) {
    uVar12 = uVar12 & 0xffffffff;
    if (c->sparse == '\0') {
      c->codewords[uVar12] = 0;
    }
    else {
      uVar1 = len[uVar12];
      *c->codewords = 0;
      *c->codeword_lengths = uVar1;
      *values = uVar11;
    }
    bVar4 = len[uVar12];
    if ((ulong)bVar4 != 0) {
      lVar5 = (ulong)bVar4 - 1;
      auVar14._8_4_ = (int)lVar5;
      auVar14._0_8_ = lVar5;
      auVar14._12_4_ = (int)((ulong)lVar5 >> 0x20);
      bVar6 = 0x1e;
      uVar12 = 0;
      auVar14 = auVar14 ^ _DAT_00126030;
      do {
        auVar15._8_4_ = (int)uVar12;
        auVar15._0_8_ = uVar12;
        auVar15._12_4_ = (int)(uVar12 >> 0x20);
        auVar15 = (auVar15 | _DAT_001266b0) ^ _DAT_00126030;
        if ((bool)(~(auVar15._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar15._0_4_ ||
                    auVar14._4_4_ < auVar15._4_4_) & 1)) {
          local_b8[uVar12 + 1] = 0x80000000 >> ((byte)uVar12 & 0x1f);
        }
        if ((auVar15._12_4_ != auVar14._12_4_ || auVar15._8_4_ <= auVar14._8_4_) &&
            auVar15._12_4_ <= auVar14._12_4_) {
          local_b8[uVar12 + 2] = 1 << (bVar6 & 0x1f);
        }
        uVar12 = uVar12 + 2;
        bVar6 = bVar6 - 2;
      } while ((bVar4 + 1 & 0xfffffffe) != uVar12);
    }
    if ((int)(uVar11 + 1) < n) {
      uVar12 = (ulong)(uVar11 + 1);
      iVar7 = 1;
      do {
        bVar4 = len[uVar12];
        uVar8 = (uint)bVar4;
        if (uVar8 == 0xff) {
          iVar10 = 0xc;
        }
        else {
          if (bVar4 != 0) {
            do {
              if (local_b8[uVar8] != 0) goto LAB_001246e0;
              bVar3 = 1 < (int)uVar8;
              uVar8 = uVar8 - 1;
            } while (bVar3);
            uVar8 = 0;
          }
LAB_001246e0:
          if (uVar8 == 0) {
            iVar10 = 1;
          }
          else {
            uVar2 = local_b8[uVar8];
            local_b8[uVar8] = 0;
            uVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
            uVar9 = (uVar9 & 0xf0f0f0f) << 4 | uVar9 >> 4 & 0xf0f0f0f;
            uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333) * 4;
            uVar11 = (uVar9 >> 1 & 0x55555555) + (uVar9 & 0x55555555) * 2;
            if (c->sparse == '\0') {
              c->codewords[uVar12] = uVar11;
            }
            else {
              c->codewords[iVar7] = uVar11;
              c->codeword_lengths[iVar7] = bVar4;
              values[iVar7] = (uint32)uVar12;
            }
            iVar7 = iVar7 + 1;
            bVar4 = len[uVar12];
            uVar13 = (ulong)bVar4;
            iVar10 = 0;
            if ((int)uVar8 < (int)(uint)bVar4) {
              bVar4 = 0x20 - bVar4;
              do {
                local_b8[uVar13] = (1 << (bVar4 & 0x1f)) + uVar2;
                uVar9 = (int)uVar13 - 1;
                uVar13 = (ulong)uVar9;
                bVar4 = bVar4 + 1;
              } while ((int)uVar8 < (int)uVar9);
            }
          }
        }
        if ((iVar10 != 0xc) && (iVar10 != 0)) {
          return 0;
        }
        uVar12 = uVar12 + 1;
      } while ((int)uVar12 < n);
    }
  }
  return 1;
}

Assistant:

static int compute_codewords(Codebook *c, uint8 *len, int n, uint32 *values)
{
   int i,k,m=0;
   uint32 available[32];

   memset(available, 0, sizeof(available));
   // find the first entry
   for (k=0; k < n; ++k) if (len[k] < NO_CODE) break;
   if (k == n) { assert(c->sorted_entries == 0); return TRUE; }
   // add to the list
   add_entry(c, 0, k, m++, len[k], values);
   // add all available leaves
   for (i=1; i <= len[k]; ++i)
      available[i] = 1U << (32-i);
   // note that the above code treats the first case specially,
   // but it's really the same as the following code, so they
   // could probably be combined (except the initial code is 0,
   // and I use 0 in available[] to mean 'empty')
   for (i=k+1; i < n; ++i) {
      uint32 res;
      int z = len[i], y;
      if (z == NO_CODE) continue;
      // find lowest available leaf (should always be earliest,
      // which is what the specification calls for)
      // note that this property, and the fact we can never have
      // more than one free leaf at a given level, isn't totally
      // trivial to prove, but it seems true and the assert never
      // fires, so!
      while (z > 0 && !available[z]) --z;
      if (z == 0) { return FALSE; }
      res = available[z];
      assert(z >= 0 && z < 32);
      available[z] = 0;
      add_entry(c, bit_reverse(res), i, m++, len[i], values);
      // propagate availability up the tree
      if (z != len[i]) {
         assert(len[i] >= 0 && len[i] < 32);
         for (y=len[i]; y > z; --y) {
            assert(available[y] == 0);
            available[y] = res + (1 << (32-y));
         }
      }
   }
   return TRUE;
}